

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_insert(REF_GRID_conflict *iso_grid_ptr,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,
              REF_DBL *in,REF_DBL **out)

{
  int iVar1;
  int iVar2;
  REF_GRID_conflict pRVar3;
  REF_DBL *pRVar4;
  REF_NODE pRVar5;
  REF_CELL pRVar6;
  undefined4 uVar7;
  REF_MPI ref_mpi;
  REF_GRID pRVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  REF_STATUS RVar13;
  REF_GLOB *pRVar14;
  ulong uVar15;
  REF_INT *pRVar16;
  REF_MPI pRVar17;
  REF_DBL *pRVar18;
  undefined8 uVar19;
  long lVar20;
  long lVar21;
  REF_EDGE pRVar22;
  void *pvVar23;
  long lVar24;
  char *pcVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  ulong uStack_230;
  REF_INT new_cell;
  REF_GRID_conflict local_220;
  REF_GLOB *local_218;
  uint local_20c;
  REF_EDGE local_208;
  void *local_200;
  int local_1f4;
  REF_MPI local_1f0;
  REF_EDGE ref_edge;
  REF_MPI local_1e0;
  REF_INT *local_1d8;
  REF_DBL *local_1d0;
  REF_DBL **local_1c8;
  REF_GRID local_1c0;
  REF_INT edge1;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  REF_INT edge2;
  REF_INT part;
  REF_INT edge0;
  uint local_194;
  uint local_190;
  undefined4 local_18c;
  REF_DBL *local_128;
  REF_GLOB global;
  REF_INT new_nodes [27];
  REF_INT nodes [27];
  
  pRVar17 = ref_grid->mpi;
  local_1c8 = out;
  uVar11 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar11 != 0) {
    uStack_230 = (ulong)uVar11;
    pcVar25 = "sync glob";
    uVar19 = 0x9f;
    goto LAB_001954b7;
  }
  local_20c = ldim;
  local_1d0 = field;
  local_1c0 = ref_grid;
  local_128 = in;
  uVar11 = ref_grid_create(iso_grid_ptr,pRVar17);
  if (uVar11 == 0) {
    pRVar3 = *iso_grid_ptr;
    uVar11 = ref_node_initialize_n_global(pRVar3->node,0);
    pRVar8 = local_1c0;
    if (uVar11 == 0) {
      uVar11 = ref_edge_create(&ref_edge,local_1c0);
      pRVar22 = ref_edge;
      if (uVar11 == 0) {
        uVar28 = (ulong)ref_edge->n;
        local_220 = pRVar3;
        if ((long)uVar28 < 0) {
          pcVar25 = "malloc new_node of REF_INT negative";
          uVar19 = 0xa6;
LAB_00195709:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 uVar19,"ref_iso_insert",pcVar25);
          return 1;
        }
        local_200 = malloc(uVar28 * 4);
        if (local_200 == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0xa6,"ref_iso_insert","malloc new_node of REF_INT NULL");
          return 2;
        }
        for (lVar20 = 0; lVar20 < (int)uVar28; lVar20 = lVar20 + 1) {
          *(undefined4 *)((long)local_200 + lVar20 * 4) = 0xffffffff;
          uVar28 = (ulong)(uint)pRVar22->n;
        }
        for (local_1f4 = 0; pRVar3 = local_220, local_1f4 < pRVar22->n; local_1f4 = local_1f4 + 1) {
          iVar26 = pRVar22->e2n[local_1f4 * 2];
          iVar27 = pRVar22->e2n[local_1f4 * 2 + 1];
          uVar11 = ref_edge_part(pRVar22,local_1f4,&part);
          pRVar3 = local_220;
          if (uVar11 != 0) {
            uStack_230 = (ulong)uVar11;
            pcVar25 = "edge part";
            uVar19 = 0xab;
            goto LAB_001954b4;
          }
          if (pRVar17->id == part) {
            dVar32 = local_1d0[iVar26];
            dVar30 = local_1d0[iVar27];
            dVar33 = dVar32;
            if (dVar32 <= dVar30) {
              dVar33 = dVar30;
            }
            if (0.0 < dVar33) {
              if (dVar30 <= dVar32) {
                dVar32 = dVar30;
              }
              if (dVar32 < 0.0) {
                uVar11 = ref_node_next_global(local_220->node,&global);
                if (uVar11 != 0) {
                  uStack_230 = (ulong)uVar11;
                  pcVar25 = "next global";
                  uVar19 = 0xb0;
                  goto LAB_001954b4;
                }
                uVar11 = ref_node_add(pRVar3->node,global,
                                      (REF_INT *)((long)local_200 + (long)local_1f4 * 4));
                if (uVar11 != 0) {
                  uStack_230 = (ulong)uVar11;
                  pcVar25 = "add node";
                  uVar19 = 0xb2;
                  goto LAB_001954b4;
                }
                dVar30 = local_1d0[iVar26];
                dVar33 = -dVar30;
                dVar32 = dVar30;
                if (dVar30 <= dVar33) {
                  dVar32 = dVar33;
                }
                dVar31 = (local_1d0[iVar27] - dVar30) * 1e+20;
                if (dVar31 <= -dVar31) {
                  dVar31 = -dVar31;
                }
                dVar30 = (double)(~-(ulong)(dVar32 < dVar31) & 0x3fe0000000000000 |
                                 (ulong)(dVar33 / (local_1d0[iVar27] - dVar30)) &
                                 -(ulong)(dVar32 < dVar31));
                dVar32 = 1.0 - dVar30;
                pRVar18 = pRVar8->node->real;
                lVar20 = (long)(iVar27 * 0xf);
                lVar21 = (long)(iVar26 * 0xf);
                pRVar4 = pRVar3->node->real;
                lVar24 = (long)*(int *)((long)local_200 + (long)local_1f4 * 4);
                pRVar4[lVar24 * 0xf] = pRVar18[lVar20] * dVar30 + pRVar18[lVar21] * dVar32;
                pRVar4[lVar24 * 0xf + 1] =
                     pRVar18[lVar20 + 1] * dVar30 + pRVar18[lVar21 + 1] * dVar32;
                pRVar4[lVar24 * 0xf + 2] =
                     pRVar18[lVar20 + 2] * dVar30 + dVar32 * pRVar18[lVar21 + 2];
              }
            }
          }
          pRVar22 = ref_edge;
        }
        uVar11 = ref_node_shift_new_globals(local_220->node);
        if (uVar11 == 0) {
          uVar28 = (ulong)(uint)ref_edge->n;
          if (ref_edge->n < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x29,"ref_iso_ghost","malloc edge_global of REF_GLOB negative");
            uStack_230 = 1;
          }
          else {
            local_208 = ref_edge;
            pRVar17 = pRVar3->mpi;
            pRVar14 = (REF_GLOB *)malloc(uVar28 * 8);
            if (pRVar14 == (REF_GLOB *)0x0) {
              pcVar25 = "malloc edge_global of REF_GLOB NULL";
              uStack_230 = 0x29;
            }
            else {
              for (uVar15 = 0; uVar28 != uVar15; uVar15 = uVar15 + 1) {
                pRVar14[uVar15] = -1;
              }
              pRVar16 = (REF_INT *)malloc(uVar28 * 4);
              if (pRVar16 == (REF_INT *)0x0) {
                pcVar25 = "malloc edge_part of REF_INT NULL";
                uStack_230 = 0x2a;
              }
              else {
                for (uVar15 = 0; uVar28 != uVar15; uVar15 = uVar15 + 1) {
                  pRVar16[uVar15] = -1;
                }
                local_1f0 = pRVar17;
                pRVar17 = (REF_MPI)malloc(uVar28 * 0x78);
                if (pRVar17 != (REF_MPI)0x0) {
                  for (lVar20 = 0; uVar28 * 0xf - lVar20 != 0; lVar20 = lVar20 + 1) {
                    *(undefined8 *)(&pRVar17->n + lVar20 * 2) = 0xc08f380000000000;
                  }
                  lVar20 = -1;
                  pvVar23 = local_200;
                  pRVar22 = local_208;
                  local_218 = pRVar14;
                  local_1e0 = pRVar17;
                  local_1d8 = pRVar16;
                  for (lVar21 = 0; ref_mpi = local_1f0, lVar21 < (int)uVar28; lVar21 = lVar21 + 1) {
                    uVar11 = *(uint *)((long)pvVar23 + lVar21 * 4);
                    nodes[0] = uVar11;
                    if ((ulong)uVar11 != 0xffffffff) {
                      uVar12 = ref_edge_part(pRVar22,(REF_INT)lVar21,new_nodes);
                      if (uVar12 != 0) {
                        uVar28 = (ulong)uVar12;
                        pcVar25 = "edge part";
                        uStack_230 = 0x31;
                        goto LAB_00195b2f;
                      }
                      pvVar23 = local_200;
                      pRVar22 = local_208;
                      if (local_1f0->id == new_nodes[0]) {
                        pRVar5 = local_220->node;
                        lVar24 = lVar20;
                        if (((-1 < (int)uVar11) && ((int)uVar11 < pRVar5->max)) &&
                           (lVar24 = pRVar5->global[uVar11], pRVar5->global[uVar11] < 0)) {
                          lVar24 = lVar20;
                        }
                        local_218[lVar21] = lVar24;
                        local_1d8[lVar21] = pRVar5->part[(int)uVar11];
                        pRVar18 = pRVar5->real;
                        for (lVar24 = 0; lVar24 != 0xf; lVar24 = lVar24 + 1) {
                          *(REF_DBL *)(&pRVar17->n + lVar24 * 2) =
                               pRVar18[(int)(uVar11 * 0xf) + lVar24];
                        }
                      }
                    }
                    uVar28 = (ulong)(uint)pRVar22->n;
                    pRVar17 = (REF_MPI)&pRVar17[2].max_tag;
                  }
                  uVar11 = ref_edge_ghost_glob(pRVar22,local_1f0,local_218);
                  if (uVar11 == 0) {
                    uVar11 = ref_edge_ghost_int(pRVar22,ref_mpi,local_1d8);
                    if (uVar11 == 0) {
                      uVar11 = ref_edge_ghost_dbl(local_208,local_1f0,(REF_DBL *)local_1e0,0xf);
                      pRVar3 = local_220;
                      if (uVar11 == 0) {
                        pRVar22 = local_208;
                        pRVar17 = local_1e0;
                        for (lVar20 = 0; lVar20 < pRVar22->n; lVar20 = lVar20 + 1) {
                          if (local_218[lVar20] != -1) {
                            uVar11 = ref_node_add(pRVar3->node,local_218[lVar20],nodes);
                            if (uVar11 != 0) {
                              uVar28 = (ulong)uVar11;
                              pcVar25 = "add node";
                              uStack_230 = 0x45;
                              goto LAB_00195b2f;
                            }
                            *(REF_INT *)((long)local_200 + lVar20 * 4) = nodes[0];
                            pRVar5 = pRVar3->node;
                            pRVar5->part[nodes[0]] = local_1d8[lVar20];
                            pRVar18 = pRVar5->real;
                            for (lVar21 = 0; pRVar22 = local_208, lVar21 != 0xf; lVar21 = lVar21 + 1
                                ) {
                              pRVar18[nodes[0] * 0xf + lVar21] =
                                   *(REF_DBL *)(&pRVar17->n + lVar21 * 2);
                            }
                          }
                          pRVar17 = (REF_MPI)&pRVar17[2].max_tag;
                        }
                        free(local_1e0);
                        free(local_1d8);
                        free(local_218);
                        if ((int)local_20c < 1) {
LAB_00196003:
                          if (local_1c0->twod == 0) {
                            pRVar6 = local_1c0->cell[8];
                            for (iVar26 = 0; iVar26 < pRVar6->max; iVar26 = iVar26 + 1) {
                              RVar13 = ref_cell_nodes(pRVar6,iVar26,nodes);
                              if (RVar13 == 0) {
                                uVar28 = 0;
                                for (lVar20 = 0; uVar10 = local_1a8, uVar9 = local_1ac,
                                    uVar12 = local_1b0, uVar11 = local_1b4, iVar27 = (int)uVar28,
                                    lVar20 < pRVar6->edge_per; lVar20 = lVar20 + 1) {
                                  lVar21 = (long)pRVar6->size_per * (long)iVar26;
                                  uVar11 = ref_edge_with(ref_edge,pRVar6->c2n
                                                                  [pRVar6->e2n[lVar20 * 2] + lVar21]
                                                         ,pRVar6->c2n
                                                          [(long)(int)lVar21 +
                                                           (long)pRVar6->e2n[lVar20 * 2 + 1]],
                                                         &local_1f4);
                                  if (uVar11 != 0) {
                                    uStack_230 = (ulong)uVar11;
                                    pcVar25 = "cell edge";
                                    uVar19 = 0xf5;
                                    goto LAB_001954b4;
                                  }
                                  iVar1 = *(int *)((long)local_200 + (long)local_1f4 * 4);
                                  (&edge1)[lVar20] = iVar1;
                                  if (iVar1 != -1) {
                                    new_nodes[iVar27] = iVar1;
                                    uVar28 = (ulong)(iVar27 + 1);
                                  }
                                }
                                if (iVar27 != 0) {
                                  if (iVar27 == 4) {
                                    local_1d0 = (REF_DBL *)CONCAT44(local_1d0._4_4_,local_1a4);
                                    local_1c8 = (REF_DBL **)CONCAT44(local_1c8._4_4_,edge1);
                                    bVar29 = (local_1a4 & edge1) == 0xffffffff;
                                    if (!bVar29) {
                                      if ((local_1b4 & local_1a8) != 0xffffffff) goto LAB_0019644e;
                                      edge0 = edge1;
                                      local_194 = local_1ac;
                                      local_190 = local_1b0;
                                      local_18c = 1;
                                      uVar11 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                      if (uVar11 != 0) {
                                        uStack_230 = (ulong)uVar11;
                                        pcVar25 = "add";
                                        uVar19 = 0x11f;
                                        goto LAB_001954b4;
                                      }
                                      edge0 = uVar12;
                                      local_194 = uVar9;
                                      local_190 = (uint)local_1d0;
                                      local_18c = 1;
                                      uVar11 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                      if (uVar11 != 0) {
                                        uStack_230 = (ulong)uVar11;
                                        pcVar25 = "add";
                                        uVar19 = 0x125;
                                        goto LAB_001954b4;
                                      }
                                      if ((uVar12 & uVar9) != 0xffffffff) goto LAB_00196201;
LAB_001966f6:
                                      pcVar25 = "found twice";
                                      uVar19 = 0x128;
                                      goto LAB_00195709;
                                    }
                                    edge0 = local_1b4;
                                    local_194 = local_1b0;
                                    local_190 = local_1a8;
                                    local_18c = 1;
                                    uVar12 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                    if (uVar12 != 0) {
                                      uStack_230 = (ulong)uVar12;
                                      pcVar25 = "add";
                                      uVar19 = 0x10f;
                                      goto LAB_001954b4;
                                    }
                                    edge0 = uVar11;
                                    local_194 = uVar10;
                                    local_190 = local_1ac;
                                    local_18c = 1;
                                    uVar12 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                    if (uVar12 != 0) {
                                      uStack_230 = (ulong)uVar12;
                                      pcVar25 = "add";
                                      uVar19 = 0x115;
                                      goto LAB_001954b4;
                                    }
                                    if ((uVar11 & uVar10) == 0xffffffff) {
                                      pcVar25 = "found twice";
                                      uVar19 = 0x118;
                                      goto LAB_00195709;
                                    }
LAB_0019644e:
                                    if ((local_1b0 == 0xffffffff) && (local_1ac == 0xffffffff)) {
                                      if (bVar29) goto LAB_001966f6;
                                      edge0 = (REF_INT)local_1c8;
                                      local_194 = uVar10;
                                      local_190 = uVar11;
                                      local_18c = 1;
                                      uVar12 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                      if (uVar12 != 0) {
                                        uStack_230 = (ulong)uVar12;
                                        pcVar25 = "add";
                                        uVar19 = 0x12f;
                                        goto LAB_001954b4;
                                      }
                                      edge0 = uVar11;
                                      local_194 = uVar10;
                                      local_190 = (uint)local_1d0;
                                      local_18c = 1;
                                      uVar11 = ref_cell_add(local_220->cell[3],&edge0,&new_cell);
                                      if (uVar11 != 0) {
                                        uStack_230 = (ulong)uVar11;
                                        pcVar25 = "add";
                                        uVar19 = 0x135;
                                        goto LAB_001954b4;
                                      }
                                    }
                                    else if (!bVar29) {
                                      pcVar25 = "not found";
                                      uVar19 = 0x137;
                                      goto LAB_00195709;
                                    }
                                  }
                                  else {
                                    if (iVar27 != 3) {
                                      printf("nedge %d\n",uVar28);
                                      pcVar25 = "implement iso surface tet intersection";
                                      uStack_230 = 6;
                                      uVar19 = 0x13c;
                                      goto LAB_001954b4;
                                    }
                                    new_nodes[3] = 1;
                                    uVar11 = ref_cell_add(local_220->cell[3],new_nodes,&new_cell);
                                    if (uVar11 != 0) {
                                      uStack_230 = (ulong)uVar11;
                                      pcVar25 = "add";
                                      uVar19 = 0x103;
                                      goto LAB_001954b4;
                                    }
                                  }
                                }
                              }
LAB_00196201:
                            }
                          }
                          else {
                            pRVar6 = local_1c0->cell[3];
                            for (iVar26 = 0; iVar26 < pRVar6->max; iVar26 = iVar26 + 1) {
                              RVar13 = ref_cell_nodes(pRVar6,iVar26,nodes);
                              if (RVar13 == 0) {
                                uVar11 = ref_edge_with(ref_edge,nodes[1],nodes[2],&edge0);
                                if (uVar11 != 0) {
                                  uStack_230 = (ulong)uVar11;
                                  pcVar25 = "e0";
                                  uVar19 = 0xd0;
                                  goto LAB_001954b4;
                                }
                                uVar11 = ref_edge_with(ref_edge,nodes[2],nodes[0],&edge1);
                                if (uVar11 != 0) {
                                  uStack_230 = (ulong)uVar11;
                                  pcVar25 = "e1";
                                  uVar19 = 0xd1;
                                  goto LAB_001954b4;
                                }
                                uVar11 = ref_edge_with(ref_edge,nodes[0],nodes[1],&edge2);
                                if (uVar11 != 0) {
                                  uStack_230 = (ulong)uVar11;
                                  pcVar25 = "e2";
                                  uVar19 = 0xd2;
                                  goto LAB_001954b4;
                                }
                                iVar27 = *(int *)((long)local_200 + (long)edge0 * 4);
                                iVar1 = *(int *)((long)local_200 + (long)edge1 * 4);
                                iVar2 = *(int *)((long)local_200 + (long)edge2 * 4);
                                if (((iVar27 == -1) && (iVar1 != -1)) && (iVar2 != -1)) {
                                  new_nodes[2] = 1;
                                  new_nodes[0] = iVar1;
                                  new_nodes[1] = iVar2;
                                  uVar11 = ref_cell_add(local_220->cell[0],new_nodes,&new_cell);
                                  if (uVar11 != 0) {
                                    uStack_230 = (ulong)uVar11;
                                    pcVar25 = "add";
                                    uVar19 = 0xda;
                                    goto LAB_001954b4;
                                  }
                                }
                                if (((iVar27 == -1) || (iVar1 != -1)) || (iVar2 == -1)) {
                                  if (((iVar27 != -1) && (iVar1 != -1)) && (iVar2 == -1)) {
                                    new_nodes[2] = 1;
                                    new_nodes[0] = iVar27;
                                    new_nodes[1] = iVar1;
                                    uVar11 = ref_cell_add(local_220->cell[0],new_nodes,&new_cell);
                                    if (uVar11 != 0) {
                                      uStack_230 = (ulong)uVar11;
                                      pcVar25 = "add";
                                      uVar19 = 0xe6;
                                      goto LAB_001954b4;
                                    }
                                  }
                                }
                                else {
                                  new_nodes[2] = 1;
                                  new_nodes[0] = iVar2;
                                  new_nodes[1] = iVar27;
                                  uVar11 = ref_cell_add(local_220->cell[0],new_nodes,&new_cell);
                                  if (uVar11 != 0) {
                                    uStack_230 = (ulong)uVar11;
                                    pcVar25 = "add";
                                    uVar19 = 0xe0;
                                    goto LAB_001954b4;
                                  }
                                }
                              }
                            }
                          }
                          free(local_200);
                          ref_edge_free(ref_edge);
                          return 0;
                        }
                        uVar11 = local_220->node->max * local_20c;
                        if ((int)uVar11 < 0) {
                          pcVar25 = "malloc *out of REF_DBL negative";
                          uStack_230 = 0x61;
LAB_00195e95:
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                 ,uStack_230,"ref_iso_interp",pcVar25);
                          uVar7 = 1;
LAB_00195f0d:
                          local_218 = (REF_GLOB *)CONCAT44(local_218._4_4_,uVar7);
                        }
                        else {
                          local_208 = ref_edge;
                          local_1e0 = local_220->mpi;
                          pRVar18 = (REF_DBL *)malloc((ulong)uVar11 << 3);
                          *local_1c8 = pRVar18;
                          if (pRVar18 == (REF_DBL *)0x0) {
                            pcVar25 = "malloc *out of REF_DBL NULL";
                            uStack_230 = 0x61;
LAB_00195f03:
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                   ,uStack_230,"ref_iso_interp",pcVar25);
                            uVar7 = 2;
                            goto LAB_00195f0d;
                          }
                          iVar26 = local_208->n;
                          uVar11 = iVar26 * local_20c;
                          if ((int)uVar11 < 0) {
                            pcVar25 = "malloc edge_real of REF_DBL negative";
                            uStack_230 = 99;
                            goto LAB_00195e95;
                          }
                          pRVar17 = (REF_MPI)malloc((ulong)uVar11 * 8);
                          local_1f0 = pRVar17;
                          if (pRVar17 == (REF_MPI)0x0) {
                            pcVar25 = "malloc edge_real of REF_DBL NULL";
                            uStack_230 = 99;
                            goto LAB_00195f03;
                          }
                          for (uVar28 = 0; uVar11 != uVar28; uVar28 = uVar28 + 1) {
                            *(undefined8 *)(&pRVar17->n + uVar28 * 2) = 0xc08f380000000000;
                          }
                          uVar28 = (ulong)local_20c;
                          local_1d8 = (REF_INT *)(uVar28 * 8);
                          for (lVar20 = 0; lVar20 < iVar26; lVar20 = lVar20 + 1) {
                            if (*(int *)((long)local_200 + lVar20 * 4) != -1) {
                              iVar26 = local_208->e2n[lVar20 * 2];
                              iVar27 = local_208->e2n[lVar20 * 2 + 1];
                              RVar13 = ref_edge_part(local_208,(REF_INT)lVar20,nodes);
                              local_218 = (REF_GLOB *)CONCAT44(local_218._4_4_,RVar13);
                              if (RVar13 != 0) {
                                pcVar25 = "edge part";
                                uStack_230 = 0x69;
                                goto LAB_00195f5c;
                              }
                              if (local_1e0->id == nodes[0]) {
                                dVar30 = local_1d0[iVar26];
                                dVar33 = -dVar30;
                                dVar32 = dVar30;
                                if (dVar30 <= dVar33) {
                                  dVar32 = dVar33;
                                }
                                dVar31 = (local_1d0[iVar27] - dVar30) * 1e+20;
                                if (dVar31 <= -dVar31) {
                                  dVar31 = -dVar31;
                                }
                                dVar30 = (double)(~-(ulong)(dVar32 < dVar31) & 0x3fe0000000000000 |
                                                 (ulong)(dVar33 / (local_1d0[iVar27] - dVar30)) &
                                                 -(ulong)(dVar32 < dVar31));
                                iVar1 = *(int *)((long)local_200 + lVar20 * 4);
                                pRVar18 = *local_1c8;
                                for (uVar15 = 0; uVar28 != uVar15; uVar15 = uVar15 + 1) {
                                  dVar32 = local_128[(long)(int)(iVar27 * local_20c) + uVar15] *
                                           dVar30 + local_128[(long)(int)(iVar26 * local_20c) +
                                                              uVar15] * (1.0 - dVar30);
                                  pRVar18[(long)(int)(iVar1 * local_20c) + uVar15] = dVar32;
                                  *(double *)(&pRVar17->n + uVar15 * 2) = dVar32;
                                }
                              }
                            }
                            iVar26 = local_208->n;
                            pRVar17 = (REF_MPI)((long)&pRVar17->n + (long)local_1d8);
                          }
                          RVar13 = ref_edge_ghost_dbl(local_208,local_1e0,(REF_DBL *)local_1f0,
                                                      local_20c);
                          local_218 = (REF_GLOB *)CONCAT44(local_218._4_4_,RVar13);
                          if (RVar13 == 0) {
                            pRVar17 = local_1f0;
                            for (lVar20 = 0; lVar20 < local_208->n; lVar20 = lVar20 + 1) {
                              if (*(int *)((long)local_200 + lVar20 * 4) != -1) {
                                RVar13 = ref_edge_part(local_208,(REF_INT)lVar20,nodes);
                                local_218 = (REF_GLOB *)CONCAT44(local_218._4_4_,RVar13);
                                if (RVar13 != 0) {
                                  pcVar25 = "edge part";
                                  uStack_230 = 0x80;
                                  goto LAB_00195f5c;
                                }
                                if (local_1e0->id != nodes[0]) {
                                  pRVar18 = *local_1c8;
                                  iVar26 = *(int *)((long)local_200 + lVar20 * 4);
                                  for (uVar15 = 0; uVar28 != uVar15; uVar15 = uVar15 + 1) {
                                    pRVar18[(int)(iVar26 * local_20c + (int)uVar15)] =
                                         *(REF_DBL *)(&pRVar17->n + uVar15 * 2);
                                  }
                                }
                              }
                              pRVar17 = (REF_MPI)((long)&pRVar17->n + (long)local_1d8);
                            }
                            free(local_1f0);
                            goto LAB_00196003;
                          }
                          pcVar25 = "edge ghost";
                          uStack_230 = 0x7a;
LAB_00195f5c:
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                                 ,uStack_230,"ref_iso_interp",(ulong)local_218 & 0xffffffff,pcVar25)
                          ;
                        }
                        pcVar25 = "interp in to out";
                        uVar19 = 0xcb;
                        uStack_230 = (ulong)local_218 & 0xffffffff;
                        goto LAB_001954b4;
                      }
                      uVar28 = (ulong)uVar11;
                      pcVar25 = "xyz ghost";
                      uStack_230 = 0x3f;
                    }
                    else {
                      uVar28 = (ulong)uVar11;
                      pcVar25 = "part ghost";
                      uStack_230 = 0x3d;
                    }
                  }
                  else {
                    uVar28 = (ulong)uVar11;
                    pcVar25 = "global ghost";
                    uStack_230 = 0x3c;
                  }
LAB_00195b2f:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,uStack_230,"ref_iso_ghost",uVar28,pcVar25);
                  uStack_230 = uVar28;
                  goto LAB_00195a73;
                }
                pcVar25 = "malloc edge_real of REF_DBL NULL";
                uStack_230 = 0x2c;
              }
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   uStack_230,"ref_iso_ghost",pcVar25);
            uStack_230 = 2;
          }
LAB_00195a73:
          pcVar25 = "new ghost";
          uVar19 = 200;
        }
        else {
          uStack_230 = (ulong)uVar11;
          pcVar25 = "shift iso glob";
          uVar19 = 0xc6;
        }
      }
      else {
        uStack_230 = (ulong)uVar11;
        pcVar25 = "create edge";
        uVar19 = 0xa5;
      }
    }
    else {
      uStack_230 = (ulong)uVar11;
      pcVar25 = "zero glob";
      uVar19 = 0xa3;
    }
  }
  else {
    uStack_230 = (ulong)uVar11;
    pcVar25 = "create";
    uVar19 = 0xa1;
  }
LAB_001954b4:
  uVar11 = (uint)uStack_230;
LAB_001954b7:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar19,
         "ref_iso_insert",uStack_230,pcVar25);
  return uVar11;
}

Assistant:

REF_FCN REF_STATUS ref_iso_insert(REF_GRID *iso_grid_ptr, REF_GRID ref_grid,
                                  REF_DBL *field, REF_INT ldim, REF_DBL *in,
                                  REF_DBL **out) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GRID iso_grid;
  REF_EDGE ref_edge;
  REF_INT *new_node;
  REF_INT edge, part, new_cell;
  REF_INT node0, node1, node2;
  REF_INT edge0, edge1, edge2;
  REF_GLOB global;
  REF_DBL t1, t0, d;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id = 1;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  RSS(ref_grid_create(iso_grid_ptr, ref_mpi), "create");
  iso_grid = *iso_grid_ptr;
  RSS(ref_node_initialize_n_global(ref_grid_node(iso_grid), 0), "zero glob");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  ref_malloc_init(new_node, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);

  each_ref_edge(ref_edge, edge) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (ref_mpi_rank(ref_mpi) == part) {
      if (MAX(field[node0], field[node1]) > 0.0 &&
          MIN(field[node0], field[node1]) < 0.0) {
        RSS(ref_node_next_global(ref_grid_node(iso_grid), &global),
            "next global");
        RSS(ref_node_add(ref_grid_node(iso_grid), global, &(new_node[edge])),
            "add node");
        d = field[node1] - field[node0];
        t1 = 0.5;
        if (ref_math_divisible(field[node0], d)) {
          t1 = -field[node0] / d;
        }
        t0 = 1.0 - t1;
        /*printf("%f %f d %f t %f\n",field[node0],field[node1],d,t);*/
        ref_node_xyz(ref_grid_node(iso_grid), 0, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 0, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 0, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 1, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 1, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 1, node0);
        ref_node_xyz(ref_grid_node(iso_grid), 2, new_node[edge]) =
            t1 * ref_node_xyz(ref_grid_node(ref_grid), 2, node1) +
            t0 * ref_node_xyz(ref_grid_node(ref_grid), 2, node0);
      }
    }
  }
  RSS(ref_node_shift_new_globals(ref_grid_node(iso_grid)), "shift iso glob");

  RSS(ref_iso_ghost(iso_grid, ref_edge, new_node), "new ghost");

  RSS(ref_iso_interp(iso_grid, ref_edge, new_node, field, ldim, in, out),
      "interp in to out");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_edge_with(ref_edge, nodes[1], nodes[2], &edge0), "e0");
      RSS(ref_edge_with(ref_edge, nodes[2], nodes[0], &edge1), "e1");
      RSS(ref_edge_with(ref_edge, nodes[0], nodes[1], &edge2), "e2");
      node0 = new_node[edge0];
      node1 = new_node[edge1];
      node2 = new_node[edge2];
      if (REF_EMPTY == node0 && REF_EMPTY != node1 && REF_EMPTY != node2) {
        new_nodes[0] = node1;
        new_nodes[1] = node2;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY == node1 && REF_EMPTY != node2) {
        new_nodes[0] = node2;
        new_nodes[1] = node0;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
      if (REF_EMPTY != node0 && REF_EMPTY != node1 && REF_EMPTY == node2) {
        new_nodes[0] = node0;
        new_nodes[1] = node1;
        new_nodes[2] = id;
        RSS(ref_cell_add(ref_grid_edg(iso_grid), new_nodes, &new_cell), "add");
      }
    }
  } else {
    REF_INT cell_edge;
    REF_INT edge_nodes[6];
    REF_INT nedge;
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_BOOL found;
    ref_cell = ref_grid_tet(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      nedge = 0;
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        RSS(ref_edge_with(ref_edge, ref_cell_e2n(ref_cell, 0, cell_edge, cell),
                          ref_cell_e2n(ref_cell, 1, cell_edge, cell), &edge),
            "cell edge");
        edge_nodes[cell_edge] = new_node[edge];
        if (REF_EMPTY != edge_nodes[cell_edge]) {
          new_nodes[nedge] = edge_nodes[cell_edge];
          nedge++;
        }
      }
      switch (nedge) {
        case 0:
          /* cell is not intersected by iso surface */
          break;
        case 3:
          new_nodes[3] = id;
          RSS(ref_cell_add(ref_grid_tri(iso_grid), new_nodes, &new_cell),
              "add");
          break;
        case 4:
          found = REF_FALSE;
          if (REF_EMPTY == edge_nodes[0] && REF_EMPTY == edge_nodes[5]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[2];
            tri_nodes[2] = edge_nodes[4];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[3];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[1] && REF_EMPTY == edge_nodes[4]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[2];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[2];
            tri_nodes[1] = edge_nodes[3];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          if (REF_EMPTY == edge_nodes[2] && REF_EMPTY == edge_nodes[3]) {
            RAS(!found, "found twice");
            found = REF_TRUE;
            tri_nodes[0] = edge_nodes[0];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[1];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
            tri_nodes[0] = edge_nodes[1];
            tri_nodes[1] = edge_nodes[4];
            tri_nodes[2] = edge_nodes[5];
            tri_nodes[3] = id;
            RSS(ref_cell_add(ref_grid_tri(iso_grid), tri_nodes, &new_cell),
                "add");
          }
          RAS(found, "not found");
          break;

        default:
          printf("nedge %d\n", nedge);
          RSS(REF_IMPLEMENT, "implement iso surface tet intersection");
          break;
      }
    }
  }

  ref_free(new_node);
  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}